

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
ethash_params_init_genesis_calcifide_check::test_method
          (ethash_params_init_genesis_calcifide_check *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_248;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]> local_238;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>
  local_218;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
  local_1f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>
  local_1d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_unsigned_long,_const_unsigned_long_&>
  local_1b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>
  local_198;
  assertion_result local_178;
  basic_cstring<const_char> local_160;
  basic_cstring<const_char> local_150;
  basic_cstring<const_char> local_140 [2];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]> local_120;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>
  local_100;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
  local_e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>
  local_c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_unsigned_long,_const_unsigned_long_&>
  local_a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>
  local_80;
  assertion_result local_60;
  basic_cstring<const_char> local_48;
  basic_cstring<const_char> local_38;
  uint local_28 [2];
  uint32_t expected_cache_size;
  uint32_t expected_full_size;
  uint64_t cache_size;
  uint64_t full_size;
  ethash_params_init_genesis_calcifide_check *this_local;
  
  full_size = (uint64_t)this;
  cache_size = ethash_get_datasize(0);
  _expected_cache_size = ethash_get_cachesize(0);
  local_28[1] = 0x3ffff880;
  local_28[0] = 0xfffec0;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_48);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_38,0xb0,&local_48);
    boost::test_tools::assertion_result::assertion_result(&local_60,cache_size == 0x3ffff880);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_120,plVar3,(char (*) [12])"\nexpected: ");
    boost::unit_test::operator<<(&local_100,&local_120,local_28);
    boost::unit_test::operator<<(&local_e0,&local_100,(char (*) [2])0x15b3a8);
    boost::unit_test::operator<<(&local_c0,&local_e0,(char (*) [9])"actual: ");
    boost::unit_test::operator<<(&local_a0,&local_c0,&cache_size);
    boost::unit_test::operator<<(&local_80,&local_a0,(char (*) [2])0x15b3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_60,&local_80,local_140,0xb0,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_80);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_unsigned_long,_const_unsigned_long_&>
    ::~lazy_ostream_impl(&local_a0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>
    ::~lazy_ostream_impl(&local_c0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_e0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>
    ::~lazy_ostream_impl(&local_100);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>::
    ~lazy_ostream_impl(&local_120);
    boost::test_tools::assertion_result::~assertion_result(&local_60);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_150,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_160);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_150,0xb3,&local_160);
    boost::test_tools::assertion_result::assertion_result
              (&local_178,_expected_cache_size == 0xfffec0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_238,plVar3,(char (*) [12])"\nexpected: ");
    boost::unit_test::operator<<(&local_218,&local_238,local_28);
    boost::unit_test::operator<<(&local_1f8,&local_218,(char (*) [2])0x15b3a8);
    boost::unit_test::operator<<(&local_1d8,&local_1f8,(char (*) [9])"actual: ");
    boost::unit_test::operator<<(&local_1b8,&local_1d8,(unsigned_long *)&expected_cache_size);
    boost::unit_test::operator<<(&local_198,&local_1b8,(char (*) [2])0x15b3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_178,&local_198,&local_248,0xb3,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_198);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_unsigned_long,_const_unsigned_long_&>
    ::~lazy_ostream_impl(&local_1b8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>
    ::~lazy_ostream_impl(&local_1d8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_1f8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>
    ::~lazy_ostream_impl(&local_218);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>::
    ~lazy_ostream_impl(&local_238);
    boost::test_tools::assertion_result::~assertion_result(&local_178);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(ethash_params_init_genesis_calcifide_check) {
	uint64_t full_size = ethash_get_datasize(0);
	uint64_t cache_size = ethash_get_cachesize(0);
	const uint32_t expected_full_size = 1073739904;
	const uint32_t expected_cache_size = 16776896;
	BOOST_REQUIRE_MESSAGE(full_size == expected_full_size,
			"\nexpected: " << expected_cache_size << "\n"
					<< "actual: " << full_size << "\n");
	BOOST_REQUIRE_MESSAGE(cache_size == expected_cache_size,
			"\nexpected: " << expected_cache_size << "\n"
					<< "actual: " << cache_size << "\n");
}